

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::python::Generator::FieldReferencingExpression
          (string *__return_storage_ptr__,Generator *this,Descriptor *containing_type,
          FieldDescriptor *field,string *python_dict_name)

{
  long *plVar1;
  long lVar2;
  LogMessage *pLVar3;
  string local_268;
  LogMessage local_248;
  pointer local_210;
  undefined4 local_208;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (*(FileDescriptor **)(field + 0x20) != this->file_) {
    internal::LogMessage::LogMessage
              (&local_248,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x2f8);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_248,"CHECK failed: (field.file()) == (file_): ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,(string *)**(undefined8 **)(field + 0x20));
    pLVar3 = internal::LogMessage::operator<<(pLVar3," vs. ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,*(string **)this->file_);
    internal::LogFinisher::operator=((LogFinisher *)&local_210,pLVar3);
    internal::LogMessage::~LogMessage(&local_248);
  }
  if (containing_type == (Descriptor *)0x0) {
    plVar1 = *(long **)field;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *plVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,plVar1[1] + lVar2);
  }
  else {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_268,this,containing_type);
    local_210 = local_268._M_dataplus._M_p;
    local_208 = (undefined4)local_268._M_string_length;
    local_60.text_ = (python_dict_name->_M_dataplus)._M_p;
    local_60.size_ = (int)python_dict_name->_M_string_length;
    local_90.text_ = (char *)**(undefined8 **)field;
    local_90.size_ = *(int *)(*(undefined8 **)field + 1);
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"$0.$1[\'$2\']",(char *)&local_210,&local_60,
               &local_90,&local_c0,&local_f0,&local_120,&local_150,&local_180,&local_1b0,&local_1e0,
               (SubstituteArg *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Generator::FieldReferencingExpression(
    const Descriptor* containing_type,
    const FieldDescriptor& field,
    const string& python_dict_name) const {
  // We should only ever be looking up fields in the current file.
  // The only things we refer to from other files are message descriptors.
  GOOGLE_CHECK_EQ(field.file(), file_) << field.file()->name() << " vs. "
                                << file_->name();
  if (!containing_type) {
    return field.name();
  }
  return strings::Substitute(
      "$0.$1['$2']",
      ModuleLevelDescriptorName(*containing_type),
      python_dict_name, field.name());
}